

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

precise_unit units::root(precise_unit *un,int power)

{
  precise_unit pVar1;
  double dVar2;
  unit_data local_2c;
  unit_data local_28;
  int local_24;
  precise_unit *ppStack_20;
  int power_local;
  precise_unit *un_local;
  undefined8 local_10;
  
  if (power == 0) {
    un_local = (precise_unit *)0x3ff0000000000000;
    local_10._0_4_ = (unit_data)0x0;
    local_10._4_4_ = 0;
  }
  else {
    local_24 = power;
    ppStack_20 = un;
    dVar2 = precise_unit::multiplier(un);
    if ((0.0 <= dVar2) || (local_24 % 2 != 0)) {
      dVar2 = precise_unit::multiplier(ppStack_20);
      dVar2 = numericalRoot<double>(dVar2,local_24);
      local_2c = precise_unit::base_units(ppStack_20);
      local_28 = detail::unit_data::root(&local_2c,local_24);
      precise_unit::precise_unit((precise_unit *)&un_local,dVar2,&local_28);
    }
    else {
      un_local = (precise_unit *)0x7ff4000000000000;
      local_10._0_4_ = (unit_data)0xfa94a488;
      local_10._4_4_ = 0;
    }
  }
  pVar1.base_units_ = local_10._0_4_;
  pVar1.commodity_ = local_10._4_4_;
  pVar1.multiplier_ = (double)un_local;
  return pVar1;
}

Assistant:

precise_unit root(const precise_unit& un, int power)
{
    if (power == 0) {
        return precise::one;
    }
    if (un.multiplier() < 0.0 && power % 2 == 0) {
        return precise::invalid;
    }
    return precise_unit{
        numericalRoot(un.multiplier(), power), un.base_units().root(power)};
}